

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_soft_max(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  ggml_tensor *pgVar2;
  int64_t iVar3;
  uint uVar4;
  uint uVar5;
  ggml_tensor *pgVar6;
  int i;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  float *y;
  void *pvVar16;
  float *y_00;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  float fVar20;
  ggml_float gVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  float local_b8;
  uint local_b4;
  float local_b0;
  float local_ac;
  ggml_tensor *local_a8;
  int64_t local_a0;
  undefined1 local_98 [16];
  int64_t local_88;
  int64_t local_80;
  ggml_tensor *local_78;
  ggml_tensor *local_70;
  long local_68;
  long local_60;
  undefined1 local_58 [16];
  float local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  auVar24 = in_ZMM1._0_16_;
  pgVar2 = dst->src[0];
  if (pgVar2->type == GGML_TYPE_F32) {
    local_b0 = (float)dst->op_params[0];
    local_a8 = dst->src[1];
    iVar1 = params->ith;
    iVar9 = params->nth;
    local_88 = pgVar2->ne[2];
    local_80 = pgVar2->ne[0];
    local_a0 = pgVar2->ne[1];
    local_98 = ZEXT416((uint)dst->op_params[1]);
    auVar22._0_8_ = std::log2<unsigned_int>((uint)local_88);
    auVar22._8_56_ = extraout_var_00;
    auVar19 = vroundsd_avx(auVar22._0_16_,auVar22._0_16_,9);
    uVar7 = vcvttsd2usi_avx512f(auVar19);
    local_b4 = 1 << (uVar7 & 0x1f);
    auVar19._8_4_ = 0x80000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar19._12_4_ = 0x80000000;
    auVar19 = vxorps_avx512vl(local_98,auVar19);
    auVar24 = vcvtusi2ss_avx512f(auVar24,local_b4);
    local_48 = exp2f(auVar19._0_4_ / auVar24._0_4_);
    auVar23._0_4_ = exp2f(((float)local_98._0_4_ * -0.5) / auVar24._0_4_);
    auVar23._4_60_ = extraout_var;
    iVar3 = pgVar2->ne[0];
    local_58 = auVar23._0_16_;
    local_78 = pgVar2;
    iVar8 = ggml_nrows(pgVar2);
    uVar7 = (uint)iVar3;
    iVar9 = (iVar9 + -1 + iVar8) / iVar9;
    iVar11 = iVar9 * iVar1;
    iVar9 = iVar9 + iVar11;
    if (iVar8 <= iVar9) {
      iVar9 = iVar8;
    }
    if (local_a8 == (ggml_tensor *)0x0) {
      bVar18 = false;
    }
    else {
      bVar18 = local_a8->type == GGML_TYPE_F16;
    }
    y = (float *)(((long)(int)uVar7 + 0x10) * (long)iVar1 * 4 + (long)params->wdata);
    local_68 = (long)iVar9;
    uVar13 = (ulong)(~((int)uVar7 >> 0x1f) & uVar7);
    local_70 = dst;
    for (lVar14 = (long)iVar11; pgVar6 = local_70, pgVar2 = local_a8, lVar14 < local_68;
        lVar14 = lVar14 + 1) {
      fVar20 = 1.0;
      if (0.0 < (float)local_98._0_4_) {
        uVar4 = (uint)((lVar14 / local_a0) % local_88);
        bVar17 = uVar4 < local_b4;
        uVar5 = (uVar4 - local_b4) * 2;
        if (bVar17) {
          uVar5 = uVar4;
        }
        auVar24 = vcvtusi2ss_avx512f(in_XMM2,uVar5 + 1);
        fVar20 = powf((float)((uint)bVar17 * (int)local_48 + (uint)!bVar17 * local_58._0_4_),
                      auVar24._0_4_);
      }
      y_00 = (float *)(pgVar6->nb[1] * lVar14 + (long)pgVar6->data);
      if (pgVar2 == (ggml_tensor *)0x0) {
        pvVar15 = (void *)0x0;
        pvVar16 = (void *)0x0;
      }
      else {
        pvVar16 = pgVar2->data;
        lVar12 = (lVar14 % local_a0) * local_80;
        pvVar15 = (void *)((long)pvVar16 + lVar12 * 2);
        pvVar16 = (void *)((long)pvVar16 + lVar12 * 4);
      }
      local_ac = fVar20;
      local_60 = lVar14;
      ggml_vec_cpy_f32(uVar7,y,(float *)(local_78->nb[1] * lVar14 + (long)local_78->data));
      ggml_vec_scale_f32(uVar7,y,local_b0);
      lVar14 = local_60;
      if (pvVar16 != (void *)0x0) {
        if (bVar18) {
          for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
            auVar24 = vfmadd213ss_fma(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar15 + uVar10 * 2) * 4)),
                                      ZEXT416((uint)local_ac),ZEXT416((uint)y[uVar10]));
            y[uVar10] = auVar24._0_4_;
          }
        }
        else {
          for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
            auVar24 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar16 + uVar10 * 4)),
                                      ZEXT416((uint)local_ac),ZEXT416((uint)y[uVar10]));
            y[uVar10] = auVar24._0_4_;
          }
        }
      }
      local_b8 = -INFINITY;
      ggml_vec_max_f32(uVar7,&local_b8,y);
      gVar21 = ggml_vec_soft_max_f32(uVar7,y_00,y,local_b8);
      ggml_vec_scale_f32(uVar7,y_00,(float)(1.0 / gVar21));
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x1290,"fatal error");
}

Assistant:

void ggml_compute_forward_soft_max(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_soft_max_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}